

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator::
~TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator
          (TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator *this)

{
  ~TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_GROUP(AccountingTestMemoryAllocator)
{
    MemoryAccountant accountant;
    AccountingTestMemoryAllocator *allocator;

    void setup() _override
    {
        allocator = new AccountingTestMemoryAllocator(accountant, getCurrentMallocAllocator());
    }

    void teardown() _override
    {
        accountant.clear();
        delete allocator;
    }
}